

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.h
# Opt level: O1

void __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::WBClearObject
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,char *addr)

{
  code *pcVar1;
  byte *pbVar2;
  bool bVar3;
  undefined4 *puVar4;
  uint i;
  uint uVar5;
  uchar retval;
  
  if ((uint)((int)addr - *(int *)&(this->super_HeapBlock).address) % (uint)this->objectSize != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.h"
                       ,0x275,"((uint)(addr - this->address) % this->objectSize == 0)",
                       "(uint)(addr - this->address) % this->objectSize == 0");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (7 < this->objectSize) {
    i = (uint)((int)addr - *(int *)&(this->super_HeapBlock).address) >> 3;
    uVar5 = (uint)(this->objectSize >> 3);
    do {
      BVStatic<512UL>::AssertRange(&this->wbVerifyBits,i);
      LOCK();
      pbVar2 = (byte *)((long)&(this->wbVerifyBits).data[0].word + ((long)(int)i >> 3));
      *pbVar2 = *pbVar2 & ~('\x01' << (i & 7));
      UNLOCK();
      i = i + 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  return;
}

Assistant:

virtual void WBClearObject(char* addr) override
    {
        Assert((uint)(addr - this->address) % this->objectSize == 0);
        uint index = (uint)(addr - this->address) / sizeof(void*);
        uint count = (uint)(this->objectSize / sizeof(void*));
        for (uint i = 0; i < count; i++)
        {
            wbVerifyBits.TestAndClearInterlocked(index + i);
        }
    }